

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O3

ENUM__gles_sampler_wrap_enum
COLLADASaxFWL15::toEnum_ENUM__gles_sampler_wrap_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__gles_sampler_wrap_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  long lVar2;
  
  SVar1 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  lVar2 = 0;
  do {
    if (*(StringHash *)((long)&enumMap->first + lVar2) == SVar1) {
      *failed = false;
      return *(ENUM__gles_sampler_wrap_enum *)((long)&enumMap->second + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  *failed = true;
  return ENUM__gles_sampler_wrap_enum__COUNT;
}

Assistant:

ENUM__gles_sampler_wrap_enum toEnum_ENUM__gles_sampler_wrap_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__gles_sampler_wrap_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__gles_sampler_wrap_enum, StringHash, ENUM__gles_sampler_wrap_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}